

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.h
# Opt level: O0

void __thiscall spv::SpvBuildLogger::~SpvBuildLogger(SpvBuildLogger *this)

{
  SpvBuildLogger *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->errors);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->warnings);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->missingFeatures);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->tbdFeatures);
  return;
}

Assistant:

class GLSLANG_EXPORT SpvBuildLogger {
public:
    SpvBuildLogger() {}

    // Registers a TBD functionality.
    void tbdFunctionality(const std::string& f);
    // Registers a missing functionality.
    void missingFunctionality(const std::string& f);

    // Logs a warning.
    void warning(const std::string& w) { warnings.push_back(w); }
    // Logs an error.
    void error(const std::string& e) { errors.push_back(e); }

    // Returns all messages accumulated in the order of:
    // TBD functionalities, missing functionalities, warnings, errors.
    std::string getAllMessages() const;

private:
    SpvBuildLogger(const SpvBuildLogger&);

    std::vector<std::string> tbdFeatures;
    std::vector<std::string> missingFeatures;
    std::vector<std::string> warnings;
    std::vector<std::string> errors;
}